

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.h
# Opt level: O2

LargeRepKind __thiscall google::protobuf::internal::MicroString::large_rep_kind(MicroString *this)

{
  LargeRepKind LVar1;
  LargeRep *pLVar2;
  LogMessageFatal LStack_18;
  
  if (((ulong)this->rep_ & 1) != 0) {
    pLVar2 = large_rep(this);
    LVar1 = kOwned;
    if (pLVar2->capacity < kOwned) {
      LVar1 = pLVar2->capacity;
    }
    return LVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.h"
             ,0x12a,"is_large_rep()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

LargeRepKind large_rep_kind() const {
    ABSL_DCHECK(is_large_rep());
    size_t cap = large_rep()->capacity;
    return cap >= kOwned ? kOwned : static_cast<LargeRepKind>(cap);
  }